

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlv.cpp
# Opt level: O0

bool __thiscall ot::commissioner::tlv::Tlv::IsValid(Tlv *this)

{
  Type TVar1;
  uint16_t uVar2;
  size_type sVar3;
  bool local_51;
  bool local_42;
  bool local_41;
  bool local_33;
  bool local_32;
  uint16_t length;
  Tlv *this_local;
  
  uVar2 = GetLength(this);
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->mValue);
  if (uVar2 == sVar3) {
    if (this->mScope == kThread) {
      TVar1 = this->mType;
      if (TVar1 == kNetworkDiagConnectivity) {
        this_local._7_1_ = uVar2 == 1;
      }
      else if (TVar1 == kCommissionerSessionId) {
        this_local._7_1_ = uVar2 == 4;
      }
      else if (TVar1 == kActiveTimestamp) {
        local_32 = false;
        if ((uint)uVar2 % 0x10 == 0) {
          local_33 = uVar2 / 0x10 != 0 && uVar2 / 0x10 < 0x10;
          local_32 = local_33;
        }
        this_local._7_1_ = local_32;
      }
      else if (TVar1 == kCommissionerUdpPort) {
        this_local._7_1_ = uVar2 == 2;
      }
      else if (TVar1 == kCommissionerToken) {
        this_local._7_1_ = true;
      }
      else if (TVar1 == kCommissionerSignature) {
        this_local._7_1_ = uVar2 < 0xff;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else if (this->mScope == kMeshLink) {
      this_local._7_1_ = false;
    }
    else if (this->mScope == kNetworkDiag) {
      switch(this->mType) {
      case kChannel:
        this_local._7_1_ = 7 < uVar2;
        break;
      case kNetworkDiagMacAddress:
        this_local._7_1_ = 1 < uVar2;
        break;
      case kExtendedPanId:
        this_local._7_1_ = uVar2 != 0;
        break;
      case kNetworkDiagTimeout:
        this_local._7_1_ = 3 < uVar2;
        break;
      case kNetworkDiagConnectivity:
        this_local._7_1_ = true;
        break;
      case kNetworkDiagRoute64:
        this_local._7_1_ = 3 < uVar2;
        break;
      case kNetworkDiagLeaderData:
        this_local._7_1_ = 7 < uVar2;
        break;
      case kNetworkDiagNetworkData:
        this_local._7_1_ = true;
        break;
      case kNetworkDiagIpv6Address:
        local_41 = (uint)uVar2 % 0x10 == 0 && uVar2 / 0x10 != 0;
        this_local._7_1_ = local_41;
        break;
      case kBorderAgentLocator:
        this_local._7_1_ = 0x23 < uVar2;
        break;
      default:
        this_local._7_1_ = false;
        break;
      case kActiveTimestamp:
        this_local._7_1_ = uVar2 != 0;
        break;
      case kCommissionerUdpPort:
        this_local._7_1_ = 1 < uVar2;
        break;
      case kNetworkDiagChildTable:
        this_local._7_1_ = true;
        break;
      case kJoinerDtlsEncapsulation:
        this_local._7_1_ = uVar2 != 0;
        break;
      case kJoinerUdpPort:
        this_local._7_1_ = uVar2 != 0;
        break;
      case kJoinerIID:
        this_local._7_1_ = 3 < uVar2;
        break;
      case kJoinerRouterLocator:
        this_local._7_1_ = true;
        break;
      case kJoinerRouterKEK:
        this_local._7_1_ = true;
        break;
      case kNetworkDiagEui64:
        this_local._7_1_ = 7 < uVar2;
        break;
      case kNetworkDiagVersion:
        this_local._7_1_ = 1 < uVar2;
        break;
      case kNetworkDiagVendorName:
        this_local._7_1_ = 3 < uVar2;
        break;
      case kNetworkDiagVendorModel:
        this_local._7_1_ = 3 < uVar2;
        break;
      case kNetworkDiagVendorSWVersion:
        this_local._7_1_ = 1 < uVar2;
        break;
      case kNetworkDiagChild:
        this_local._7_1_ = 0x2a < uVar2;
        break;
      case kNetworkDiagChildIpv6Address:
        local_42 = (uint)uVar2 % 0x10 == 2 && uVar2 / 0x10 != 0;
        this_local._7_1_ = local_42;
        break;
      case kNetworkDiagRouterNeighbor:
        this_local._7_1_ = 0x17 < uVar2;
        break;
      case kNetworkDiagAnswer:
        this_local._7_1_ = 1 < uVar2;
        break;
      case kNetworkDiagQueryID:
        this_local._7_1_ = 1 < uVar2;
        break;
      case kNetworkDiagMleCounters:
        this_local._7_1_ = 0x41 < uVar2;
      }
    }
    else {
      switch(this->mType) {
      case kChannel:
        this_local._7_1_ = uVar2 == 3;
        break;
      case kNetworkDiagMacAddress:
        this_local._7_1_ = uVar2 == 2;
        break;
      case kExtendedPanId:
        this_local._7_1_ = uVar2 == 8;
        break;
      case kNetworkDiagTimeout:
        this_local._7_1_ = uVar2 < 0x11;
        break;
      case kNetworkDiagConnectivity:
        this_local._7_1_ = uVar2 < 0x11;
        break;
      case kNetworkDiagRoute64:
        this_local._7_1_ = uVar2 == 0x10;
        break;
      case kNetworkDiagLeaderData:
        this_local._7_1_ = uVar2 == 4;
        break;
      case kNetworkDiagNetworkData:
        this_local._7_1_ = uVar2 == 8;
        break;
      case kNetworkDiagIpv6Address:
        this_local._7_1_ = uVar2 < 0x11;
        break;
      case kBorderAgentLocator:
        this_local._7_1_ = uVar2 == 2;
        break;
      case kCommissionerId:
        this_local._7_1_ = uVar2 < 0x41;
        break;
      case kCommissionerSessionId:
        this_local._7_1_ = uVar2 == 2;
        break;
      case kSecurityPolicy:
        local_51 = uVar2 == 3 || uVar2 == 4;
        this_local._7_1_ = local_51;
        break;
      case kGet:
        this_local._7_1_ = uVar2 < 0xff;
        break;
      case kActiveTimestamp:
        this_local._7_1_ = uVar2 == 8;
        break;
      case kCommissionerUdpPort:
        this_local._7_1_ = uVar2 == 2;
        break;
      case kNetworkDiagChildTable:
        this_local._7_1_ = uVar2 == 1;
        break;
      case kJoinerDtlsEncapsulation:
        this_local._7_1_ = true;
        break;
      case kJoinerUdpPort:
        this_local._7_1_ = uVar2 == 2;
        break;
      case kJoinerIID:
        this_local._7_1_ = uVar2 == 8;
        break;
      case kJoinerRouterLocator:
        this_local._7_1_ = uVar2 == 2;
        break;
      case kJoinerRouterKEK:
        this_local._7_1_ = uVar2 == 0x10;
        break;
      case kNetworkDiagAnswer:
        this_local._7_1_ = uVar2 < 0x41;
        break;
      case kNetworkDiagQueryID:
        this_local._7_1_ = uVar2 < 0x21;
        break;
      case kNetworkDiagMleCounters:
        this_local._7_1_ = uVar2 < 0x21;
        break;
      case kVendorSWVersion:
        this_local._7_1_ = uVar2 < 0x11;
        break;
      case kVendorData:
        this_local._7_1_ = uVar2 < 0x41;
        break;
      case kVendorStackVersion:
        this_local._7_1_ = uVar2 < 0xff;
        break;
      case kUdpEncapsulation:
        this_local._7_1_ = 3 < uVar2;
        break;
      case kIpv6Address:
        this_local._7_1_ = uVar2 == 0x10;
        break;
      case kPendingTimestamp:
        this_local._7_1_ = uVar2 == 8;
        break;
      case kDelayTimer:
        this_local._7_1_ = uVar2 == 4;
        break;
      case kChannelMask:
        this_local._7_1_ = uVar2 < 0xff;
        break;
      case kCount:
        this_local._7_1_ = uVar2 == 1;
        break;
      case kPeriod:
        this_local._7_1_ = uVar2 == 2;
        break;
      case kScanDuration:
        this_local._7_1_ = uVar2 == 2;
        break;
      case kEnergyList:
        this_local._7_1_ = uVar2 < 0xff;
        break;
      case kSecureDissemination:
        this_local._7_1_ = uVar2 < 0xff;
        break;
      case kDomainName:
        this_local._7_1_ = uVar2 < 0x11;
        break;
      case kDomainPrefix:
        this_local._7_1_ = true;
        break;
      case kAeSteeringData:
        this_local._7_1_ = uVar2 < 0x11;
        break;
      case kNmkpSteeringData:
        this_local._7_1_ = uVar2 < 0x11;
        break;
      case kCommissionerToken:
        this_local._7_1_ = true;
        break;
      case kCommissionerSignature:
        this_local._7_1_ = uVar2 < 0xff;
        break;
      case kAeUdpPort:
        this_local._7_1_ = uVar2 == 2;
        break;
      case kNmkpUdpPort:
        this_local._7_1_ = uVar2 == 2;
        break;
      case kTriHostname:
        this_local._7_1_ = uVar2 < 0xff;
        break;
      case kRegistrarIpv6Address:
        this_local._7_1_ = uVar2 == 0x10;
        break;
      case kRegistrarHostname:
        this_local._7_1_ = uVar2 < 0xff;
        break;
      case kCommissionerPenSignature:
        this_local._7_1_ = uVar2 < 0xff;
        break;
      case kDiscoveryRequest:
        this_local._7_1_ = uVar2 == 2;
        break;
      case kDiscoveryResponse:
        this_local._7_1_ = uVar2 == 2;
        break;
      default:
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Tlv::IsValid() const
{
    auto length = GetLength();

    // The length is cutted off.
    if (length != mValue.size())
    {
        return false;
    }

    if (mScope == Scope::kThread)
    {
        switch (mType)
        {
        // Thread Network Layer TLVs
        case Type::kThreadStatus:
            return length == 1;
        case Type::kThreadTimeout:
            return length == 4;
        case Type::kThreadIpv6Addresses:
            return (length % 16 == 0) && (length / 16 >= 1 && length / 16 <= 15);
        case Type::kThreadCommissionerSessionId:
            return length == 2;
        case Type::kThreadCommissionerToken:
            return true;
        case Type::kThreadCommissionerSignature:
            return length < kEscapeLength;
        default:
            return false;
        }
    }
    else if (mScope == Scope::kMeshLink)
    {
        return false;
    }
    else if (mScope == Scope::kNetworkDiag)
    {
        switch (mType)
        {
        // Network disgnostic layer TLVs
        case Type::kNetworkDiagExtMacAddress:
            return length >= 8;
        case Type::kNetworkDiagMacAddress:
            return length >= 2;
        case Type::kNetworkDiagMode:
            return length >= 1;
        case Type::kNetworkDiagTimeout:
            return length >= 4;
        case Type::kNetworkDiagConnectivity:
            return true;
        case Type::kNetworkDiagRoute64:
            return length >= 4;
        case Type::kNetworkDiagLeaderData:
            return length >= 8;
        case Type::kNetworkDiagNetworkData:
            return true;
        case Type::kNetworkDiagIpv6Address:
            return (length % 16 == 0) && (length / 16 >= 1);
        case Type::kNetworkDiagMacCounters:
            return length >= 36;
        case Type::kNetworkDiagBatteryLevel:
            return length >= 1;
        case Type::kNetworkDiagSupplyVoltage:
            return length >= 2;
        case Type::kNetworkDiagChildTable:
            return true; // list of 0 or more child entry data
        case Type::kNetworkDiagChannelPages:
            return length >= 1; // 1 or more 8-bit integers
        case Type::kNetworkDiagTypeList:
            return length >= 1; // 1 or more 8-bit integers
        case Type::kNetworkDiagMaxChildTimeout:
            return length >= 4;
        case Type::kNetworkDiagLDevIDSubjectPubKeyInfo:
            return true;
        case Type::kNetworkDiagIDevIDCert:
            return true;
        case Type::kNetworkDiagEui64:
            return length >= 8;
        case Type::kNetworkDiagVersion:
            return length >= 2;
        case Type::kNetworkDiagVendorName:
            return length >= 4;
        case Type::kNetworkDiagVendorModel:
            return length >= 4;
        case Type::kNetworkDiagVendorSWVersion:
            return length >= 2;
        case Type::kNetworkDiagChild:
            return length >= 43;
        case Type::kNetworkDiagChildIpv6Address:
            return (length % 16 == 2) && (length / 16 >= 1);
        case Type::kNetworkDiagRouterNeighbor:
            return length >= 24;
        case Type::kNetworkDiagAnswer:
            return length >= 2;
        case Type::kNetworkDiagQueryID:
            return length >= 2;
        case Type::kNetworkDiagMleCounters:
            return length >= 66;
        default:
            return false;
        }
    }

    switch (mType)
    {
    // Network Management TLVs
    case Type::kChannel:
        return length == 3;
    case Type::kPanId:
        return length == 2;
    case Type::kExtendedPanId:
        return length == 8;
    case Type::kNetworkName:
        return length <= 16;
    case Type::kPSKc:
        return length <= 16;
    case Type::kNetworkMasterKey:
        return length == 16;
    case Type::kNetworkKeySequenceCounter:
        return length == 4;
    case Type::kNetworkMeshLocalPrefix:
        return length == 8;
    case Type::kSteeringData:
        return length <= 16;
    case Type::kBorderAgentLocator:
        return length == 2;
    case Type::kCommissionerId:
        return length <= 64;
    case Type::kCommissionerSessionId:
        return length == 2;
    case Type::kActiveTimestamp:
        return length == 8;
    case Type::kCommissionerUdpPort:
        return length == 2;
    case Type::kSecurityPolicy:
        return length == 3 || length == 4;
    case Type::kPendingTimestamp:
        return length == 8;
    case Type::kDelayTimer:
        return length == 4;
    case Type::kChannelMask:
        return length < kEscapeLength;

    // MeshCoP Protocol Command TLVs
    case Type::kGet:
        return length < kEscapeLength;
    case Type::kState:
        return length == 1;
    case Type::kJoinerDtlsEncapsulation:
        return true;
    case Type::kJoinerUdpPort:
        return length == 2;
    case Type::kJoinerIID:
        return length == 8;
    case Type::kJoinerRouterLocator:
        return length == 2;
    case Type::kJoinerRouterKEK:
        return length == kJoinerRouterKekLength;
    case Type::kCount:
        return length == 1;
    case Type::kPeriod:
        return length == 2;
    case Type::kScanDuration:
        return length == 2;
    case Type::kEnergyList:
        return length < kEscapeLength;
    case Type::kSecureDissemination:
        return length < kEscapeLength;

    // TMF Provisioning and Discovery TLVs
    case Type::kProvisioningURL:
        return length <= 64;
    case Type::kVendorName:
        return length <= 32;
    case Type::kVendorModel:
        return length <= 32;
    case Type::kVendorSWVersion:
        return length <= 16;
    case Type::kVendorData:
        return length <= 64;
    case Type::kVendorStackVersion:
        return length < kEscapeLength;
    case Type::kUdpEncapsulation:
        return length >= 4;
    case Type::kIpv6Address:
        return length == 16;
    case Type::kDomainName:
        return length <= 16;
    case Type::kDomainPrefix:
        return true; // Reserved.
    case Type::kAeSteeringData:
        return length <= 16;
    case Type::kNmkpSteeringData:
        return length <= 16;
    case Type::kCommissionerToken:
        return true;
    case Type::kCommissionerSignature:
        return length < kEscapeLength;
    case Type::kAeUdpPort:
        return length == 2;
    case Type::kNmkpUdpPort:
        return length == 2;
    case Type::kTriHostname:
        return length < kEscapeLength;
    case Type::kRegistrarIpv6Address:
        return length == 16;
    case Type::kRegistrarHostname:
        return length < kEscapeLength;
    case Type::kCommissionerPenSignature:
        return length < kEscapeLength;
    case Type::kDiscoveryRequest:
        return length == 2;
    case Type::kDiscoveryResponse:
        return length == 2;

    default:
        return false;
    }
}